

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O0

void __thiscall
TPZFrontSym<std::complex<long_double>_>::Compress(TPZFrontSym<std::complex<long_double>_> *this)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  int64_t iVar4;
  int64_t iVar5;
  complex<long_double> *pcVar6;
  long in_RDI;
  int frontold;
  int64_t j;
  int64_t i;
  int64_t nfound;
  TPZStack<long,_10> from;
  undefined2 in_stack_fffffffffffffe90;
  undefined6 in_stack_fffffffffffffe92;
  complex<long_double> *in_stack_fffffffffffffe98;
  TPZFrontSym<std::complex<long_double>_> *in_stack_fffffffffffffea0;
  int64_t in_stack_fffffffffffffeb8;
  TPZManVector<long,_10> *in_stack_fffffffffffffec0;
  long local_90;
  long local_88;
  TPZVec<long> local_78 [3];
  
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)in_stack_fffffffffffffea0);
  for (local_88 = 0; local_88 < *(long *)(in_RDI + 0xa0); local_88 = local_88 + 1) {
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_88);
    if (*plVar3 != -1) {
      TPZStack<long,_10>::Push
                ((TPZStack<long,_10> *)in_stack_fffffffffffffea0,(long)in_stack_fffffffffffffe98);
    }
  }
  iVar4 = TPZVec<long>::NElements(local_78);
  for (local_88 = 0; local_88 < iVar4; local_88 = local_88 + 1) {
    plVar3 = TPZVec<long>::operator[](local_78,local_88);
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),*plVar3);
    lVar2 = *plVar3;
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_88);
    *plVar3 = lVar2;
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_88);
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),*plVar3);
    *plVar3 = local_88;
  }
  for (; iVar5 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x10)), local_88 < iVar5;
      local_88 = local_88 + 1) {
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_88);
    *plVar3 = -1;
  }
  iVar5 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0xb0));
  if (iVar4 + iVar5 != *(long *)(in_RDI + 0xa0)) {
    std::operator<<((ostream *)&std::cout,"TPZFront.Compress inconsistent data structure\n");
  }
  iVar1 = *(int *)(in_RDI + 0xa0);
  *(int64_t *)(in_RDI + 0xa0) = iVar4;
  TPZManVector<int,_10>::Resize
            ((TPZManVector<int,_10> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  TPZManVector<long,_10>::Resize(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  iVar5 = TPZVec<std::complex<long_double>_>::NElements
                    ((TPZVec<std::complex<long_double>_> *)(in_RDI + 0xf8));
  if (iVar5 != 0) {
    for (local_90 = 0; local_90 < iVar4; local_90 = local_90 + 1) {
      for (local_88 = 0; local_88 <= local_90; local_88 = local_88 + 1) {
        TPZVec<long>::operator[](local_78,local_88);
        TPZVec<long>::operator[](local_78,local_90);
        pcVar6 = Element(in_stack_fffffffffffffea0,(int64_t)in_stack_fffffffffffffe98,
                         CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90));
        in_stack_fffffffffffffea0 =
             (TPZFrontSym<std::complex<long_double>_> *)
             Element(in_stack_fffffffffffffea0,(int64_t)in_stack_fffffffffffffe98,
                     CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90));
        ((TPZVec<long> *)
        &(in_stack_fffffffffffffea0->super_TPZFront<std::complex<long_double>_>).super_TPZSavable)->
        _vptr_TPZVec = *(_func_int ***)pcVar6->_M_value;
        *(long **)&(in_stack_fffffffffffffea0->super_TPZFront<std::complex<long_double>_>).fWork =
             *(long **)(pcVar6->_M_value + 8);
        (in_stack_fffffffffffffea0->super_TPZFront<std::complex<long_double>_>).fGlobal.
        super_TPZVec<long>._vptr_TPZVec = *(_func_int ***)(pcVar6->_M_value + 0x10);
        (in_stack_fffffffffffffea0->super_TPZFront<std::complex<long_double>_>).fGlobal.
        super_TPZVec<long>.fStore = *(long **)(pcVar6->_M_value + 0x18);
      }
    }
    for (; local_90 < iVar1; local_90 = local_90 + 1) {
      for (local_88 = 0; local_88 <= local_90; local_88 = local_88 + 1) {
        in_stack_fffffffffffffe98 =
             Element(in_stack_fffffffffffffea0,(int64_t)in_stack_fffffffffffffe98,
                     CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90));
        in_stack_fffffffffffffe90 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
        std::complex<long_double>::operator=(in_stack_fffffffffffffe98,(longdouble)0);
      }
    }
  }
  TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1d33d56);
  return;
}

Assistant:

void TPZFrontSym<TVar>::Compress(){
	//	PrintGlobal("Before COmpress",output);
	//	Print("Before Compress", cout);
	TPZStack <int64_t> from;
	int64_t nfound;
	int64_t i, j;
	for(i = 0; i < this->fFront; i++){
		if(this->fGlobal[i] != -1) from.Push(i);
	}
	
	/**
	 *First this->fLocal initialization
	 *Any needed updates is done on next loop
	 */
	nfound = from.NElements();
	for(i=0;i<nfound;i++) {
		this->fGlobal[i]=this->fGlobal[from[i]];
		//fGlobal[from[i]] = -1;
		this->fLocal[this->fGlobal[i]] = i;
	}
	for(;i<this->fGlobal.NElements();i++) this->fGlobal[i] = -1;
	
	if(nfound+this->fFree.NElements()!=this->fFront) cout << "TPZFront.Compress inconsistent data structure\n";
	int frontold = this->fFront;
	this->fFront = nfound;
	this->fFree.Resize(0);	
	this->fGlobal.Resize(this->fFront);
	if(this->fData.NElements()==0) return;
	
	for(j = 0; j < nfound; j++){
		for(i = 0; i <= j; i++){
			Element(i,j) = Element(from[i], from[j]);
		}
		//		fGlobal[i] = fGlobal[from[i]];
		//		this->fLocal[fGlobal[i]] = i;
	}
	for(;j<frontold;j++) {
		for(i=0;i<= j; i++) Element(i,j) = 0.;
	}
	
	//	Print("After Compress", cout);
	//	PrintGlobal("After Compress",output);
}